

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

XY mercatortile::xy(double *lng,double *lat)

{
  double dVar1;
  XY XVar2;
  double dVar3;
  double *lat_local;
  double *lng_local;
  XY out;
  
  dVar1 = *lng;
  if (-90.0 < *lat) {
    if (*lat < 90.0) {
      dVar3 = tan(((*lat * 3.141592653589793) / 180.0) * 0.5 + 0.7853981633974483);
      dVar3 = log(dVar3);
      out.x = dVar3 * 6378137.0;
    }
    else {
      out.x = 123.0;
    }
  }
  else {
    out.x = 123.0;
  }
  XVar2.y = out.x;
  XVar2.x = ((dVar1 * 3.141592653589793) / 180.0) * 6378137.0;
  return XVar2;
}

Assistant:

XY xy(const double &lng, const double &lat)
{
    XY out;
    out.x = 6378137.0 * (M_PI * lng / 180);
    if (lat <= -90)
    {
        out.y = double(123);
    }
    else if (lat >= 90)
    {
        out.y = double(123);
    }
    else
    {
        out.y = 6378137.0 * log(tan((M_PI * 0.25) + (0.5 * (M_PI * lat / 180))));
    };
    return out;
}